

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

void __thiscall
flatbuffers::FlatBufPrinter::FlatBufPrinter(FlatBufPrinter *this,string *str,char indentation_type)

{
  char indentation_type_local;
  string *str_local;
  FlatBufPrinter *this_local;
  
  grpc_generator::Printer::Printer(&this->super_Printer);
  (this->super_Printer)._vptr_Printer = (_func_int **)&PTR__FlatBufPrinter_004fb2d8;
  this->str_ = str;
  this->escape_char_ = '$';
  this->indent_ = 0;
  this->indentation_size_ = 2;
  this->indentation_type_ = indentation_type;
  return;
}

Assistant:

FlatBufPrinter(std::string *str, const char indentation_type)
      : str_(str),
        escape_char_('$'),
        indent_(0),
        indentation_size_(2),
        indentation_type_(indentation_type) {}